

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O0

int detect_data_type(deflate_state *s)

{
  int local_24;
  ulong uStack_20;
  int n;
  unsigned_long block_mask;
  deflate_state *s_local;
  
  uStack_20 = 0xf3ffc07f;
  local_24 = 0;
  while( true ) {
    if (0x1f < local_24) {
      if (((s->dyn_ltree[9].fc.freq == 0) && (s->dyn_ltree[10].fc.freq == 0)) &&
         (s->dyn_ltree[0xd].fc.freq == 0)) {
        for (local_24 = 0x20; local_24 < 0x100; local_24 = local_24 + 1) {
          if (s->dyn_ltree[local_24].fc.freq != 0) {
            return 1;
          }
        }
        s_local._4_4_ = 0;
      }
      else {
        s_local._4_4_ = 1;
      }
      return s_local._4_4_;
    }
    if (((uStack_20 & 1) != 0) && (s->dyn_ltree[local_24].fc.freq != 0)) break;
    local_24 = local_24 + 1;
    uStack_20 = uStack_20 >> 1;
  }
  return 0;
}

Assistant:

local int detect_data_type(s)
    deflate_state *s;
{
    /* block_mask is the bit mask of block-listed bytes
     * set bits 0..6, 14..25, and 28..31
     * 0xf3ffc07f = binary 11110011111111111100000001111111
     */
    unsigned long block_mask = 0xf3ffc07fUL;
    int n;

    /* Check for non-textual ("block-listed") bytes. */
    for (n = 0; n <= 31; n++, block_mask >>= 1)
        if ((block_mask & 1) && (s->dyn_ltree[n].Freq != 0))
            return Z_BINARY;

    /* Check for textual ("allow-listed") bytes. */
    if (s->dyn_ltree[9].Freq != 0 || s->dyn_ltree[10].Freq != 0
            || s->dyn_ltree[13].Freq != 0)
        return Z_TEXT;
    for (n = 32; n < LITERALS; n++)
        if (s->dyn_ltree[n].Freq != 0)
            return Z_TEXT;

    /* There are no "block-listed" or "allow-listed" bytes:
     * this stream either is empty or has tolerated ("gray-listed") bytes only.
     */
    return Z_BINARY;
}